

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O0

void __thiscall
ScriptUtil_GetP2shLockingScriptTest_Test::ScriptUtil_GetP2shLockingScriptTest_Test
          (ScriptUtil_GetP2shLockingScriptTest_Test *this)

{
  ScriptUtil_GetP2shLockingScriptTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ScriptUtil_GetP2shLockingScriptTest_Test_0088e238;
  return;
}

Assistant:

TEST(ScriptUtil, GetP2shLockingScriptTest) {
  const std::vector<ScriptUtil_ScriptTestVector> test_vectors = {
    {
      // 00 11 2222 333333 4444 55 6666 777777 8888 99
      Script("01000111022222033333330244440155026666037777770288880199"),
      Script("a914f1b3a2cc24eba8a741f963b309a7686f3bb6bfb487")
    },
    {
      // p2pkh locking script
      Script("76a914edaf2414751239b72b653ea004adc310a3522e3788ac"),
      Script("a914fc3ddf7d4677ad022910dabd15c1fd14f5e7a15b87")
    },
    {
      // p2wpkh locking script
      Script("0014edaf2414751239b72b653ea004adc310a3522e37"),
      Script("a91430cf0c44f55fe85b110d6bcdc771f1866c1f506f87")
    },
  };

  Script actual;
  for (const ScriptUtil_ScriptTestVector& test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2shLockingScript(test_vector.input_redeem_script)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
    ByteData160 script_hash = HashUtil::Hash160(test_vector.input_redeem_script);
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2shLockingScript(script_hash)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
  }
}